

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_read_header_procedure
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  opj_j2k_mct_function *pp_Var1;
  OPJ_UINT32 OVar2;
  opj_codestream_index_t *poVar3;
  opj_dec_memory_marker_handler_t *poVar4;
  OPJ_BOOL OVar5;
  int iVar6;
  OPJ_SIZE_T OVar7;
  OPJ_OFF_T OVar8;
  OPJ_BYTE *pOVar9;
  opj_dec_memory_marker_handler_t *e;
  opj_dec_memory_marker_handler_t *poVar10;
  char *pcVar11;
  opj_j2k_mct_function *pp_Var12;
  OPJ_UINT32 OVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  OPJ_UINT32 l_marker_size;
  OPJ_UINT32 l_current_marker;
  uint local_48;
  OPJ_UINT32 local_44;
  int local_40;
  int local_3c;
  int local_38;
  uint local_34;
  
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1c0f,
                  "OPJ_BOOL opj_j2k_read_header_procedure(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1c10,
                  "OPJ_BOOL opj_j2k_read_header_procedure(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0x1c11,
                  "OPJ_BOOL opj_j2k_read_header_procedure(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  (p_j2k->m_specific_param).m_decoder.m_state = 1;
  OVar7 = opj_stream_read_data(p_stream,(OPJ_BYTE *)&local_44,2,p_manager);
  if ((OVar7 == 2) && (opj_read_bytes_LE((OPJ_BYTE *)&local_44,&local_34,2), local_34 == 0xff4f)) {
    (p_j2k->m_specific_param).m_decoder.m_state = 2;
    OVar8 = opj_stream_tell(p_stream);
    p_j2k->cstr_index->main_head_start = OVar8 + -2;
    opj_event_msg(p_manager,4,"Start to read j2k main header (%d).\n");
    OVar5 = opj_j2k_add_mhmarker(p_j2k->cstr_index,0xff4f,p_j2k->cstr_index->main_head_start,2);
    if (OVar5 != 0) {
      OVar7 = opj_stream_read_data
                        (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager);
      if (OVar7 != 2) {
LAB_00110669:
        pcVar11 = "Stream too short\n";
        goto LAB_00110352;
      }
      opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&local_44,2);
      bVar14 = true;
      bVar15 = true;
      bVar16 = true;
      if (local_44 != 0xff90) {
        local_38 = 0;
        local_3c = 0;
        local_40 = 0;
LAB_0011038a:
        if (local_44 < 0xff00) {
          opj_event_msg(p_manager,1,"A marker ID was expected (0xff--) instead of %.8x\n");
          return 0;
        }
        pp_Var12 = j2k_mct_write_functions_from_float + 2;
        do {
          OVar13 = *(OPJ_UINT32 *)(pp_Var12 + 2);
          pp_Var12 = pp_Var12 + 2;
          if (OVar13 == 0) break;
        } while (OVar13 != local_44);
        if (OVar13 == 0) {
          opj_event_msg(p_manager,2,"Unknown marker\n");
          OVar7 = opj_stream_read_data
                            (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager)
          ;
          if (OVar7 == 2) {
            OVar13 = 2;
            do {
              opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&local_34,2);
              if (0xfeff < local_34) {
                poVar4 = j2k_memory_marker_handler_tab;
                do {
                  poVar10 = poVar4;
                  OVar2 = poVar10->id;
                  if (OVar2 == 0) break;
                  poVar4 = poVar10 + 1;
                } while (OVar2 != local_34);
                if (((p_j2k->m_specific_param).m_decoder.m_state & poVar10->states) == 0) {
                  pcVar11 = "Marker is not compliant with its position\n";
                  goto LAB_001106a6;
                }
                if (OVar2 != 0) goto LAB_00110511;
                OVar13 = OVar13 + 2;
              }
              OVar7 = opj_stream_read_data
                                (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,
                                 p_manager);
              if (OVar7 != 2) break;
            } while( true );
          }
          pcVar11 = "Stream too short\n";
          goto LAB_001106a6;
        }
        goto LAB_001103b4;
      }
      goto LAB_00110322;
    }
    opj_event_msg(p_manager,1,"Not enough memory to add mh marker\n");
  }
  pcVar11 = "Expected a SOC marker \n";
LAB_00110352:
  opj_event_msg(p_manager,1,pcVar11);
  return 0;
LAB_00110511:
  if (OVar2 != 0xff90) {
    poVar3 = p_j2k->cstr_index;
    OVar8 = opj_stream_tell(p_stream);
    OVar5 = opj_j2k_add_mhmarker(poVar3,0,(ulong)((int)OVar8 - OVar13),OVar13);
    if (OVar5 == 0) {
      pcVar11 = "Not enough memory to add mh marker\n";
LAB_001106a6:
      opj_event_msg(p_manager,1,pcVar11);
      pcVar11 = "Unknow marker have been detected and generated error.\n";
      goto LAB_00110352;
    }
  }
  local_44 = OVar2;
  if (OVar2 == 0xff90) goto LAB_0011064b;
  pp_Var12 = j2k_mct_write_functions_from_float + 2;
  do {
    pp_Var1 = pp_Var12 + 2;
    pp_Var12 = pp_Var12 + 2;
    if (*(OPJ_UINT32 *)pp_Var1 == 0) break;
  } while (*(OPJ_UINT32 *)pp_Var1 != OVar2);
LAB_001103b4:
  OVar13 = *(OPJ_UINT32 *)pp_Var12;
  if (OVar13 == 0xff51) {
    local_40 = 1;
  }
  if (OVar13 == 0xff52) {
    local_3c = 1;
  }
  if (OVar13 == 0xff5c) {
    local_38 = 1;
  }
  if (((p_j2k->m_specific_param).m_decoder.m_state & *(OPJ_UINT32 *)((long)pp_Var12 + 4)) == 0) {
    pcVar11 = "Marker is not compliant with its position\n";
    goto LAB_00110352;
  }
  OVar7 = opj_stream_read_data
                    (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager);
  if (OVar7 != 2) goto LAB_00110669;
  opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&local_48,2);
  local_48 = local_48 - 2;
  if ((p_j2k->m_specific_param).m_decoder.m_header_data_size < local_48) {
    pOVar9 = (OPJ_BYTE *)
             opj_realloc((p_j2k->m_specific_param).m_decoder.m_header_data,(ulong)local_48);
    if (pOVar9 == (OPJ_BYTE *)0x0) {
      opj_free((p_j2k->m_specific_param).m_decoder.m_header_data);
      (p_j2k->m_specific_param).m_decoder.m_header_data = (OPJ_BYTE *)0x0;
      (p_j2k->m_specific_param).m_decoder.m_header_data_size = 0;
      opj_event_msg(p_manager,1,"Not enough memory to read header\n");
      return 0;
    }
    (p_j2k->m_specific_param).m_decoder.m_header_data = pOVar9;
    (p_j2k->m_specific_param).m_decoder.m_header_data_size = local_48;
  }
  OVar7 = opj_stream_read_data
                    (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,(ulong)local_48,
                     p_manager);
  if (OVar7 != local_48) goto LAB_00110669;
  iVar6 = (*pp_Var12[1])(p_j2k,(p_j2k->m_specific_param).m_decoder.m_header_data,local_48);
  if (iVar6 == 0) {
    pcVar11 = "Marker handler function failed to read the marker segment\n";
    goto LAB_00110352;
  }
  poVar3 = p_j2k->cstr_index;
  OVar8 = opj_stream_tell(p_stream);
  OVar5 = opj_j2k_add_mhmarker(poVar3,OVar13,(ulong)(((int)OVar8 - local_48) - 4),local_48 + 4);
  if (OVar5 == 0) {
    pcVar11 = "Not enough memory to add mh marker\n";
    goto LAB_00110352;
  }
  OVar7 = opj_stream_read_data
                    (p_stream,(p_j2k->m_specific_param).m_decoder.m_header_data,2,p_manager);
  if (OVar7 != 2) goto LAB_00110669;
  opj_read_bytes_LE((p_j2k->m_specific_param).m_decoder.m_header_data,&local_44,2);
  if (local_44 == 0xff90) goto LAB_0011064b;
  goto LAB_0011038a;
LAB_0011064b:
  bVar14 = local_40 == 0;
  bVar15 = local_3c == 0;
  bVar16 = local_38 == 0;
LAB_00110322:
  if (bVar14) {
    pcVar11 = "required SIZ marker not found in main header\n";
  }
  else if (bVar15) {
    pcVar11 = "required COD marker not found in main header\n";
  }
  else if (bVar16) {
    pcVar11 = "required QCD marker not found in main header\n";
  }
  else {
    OVar5 = opj_j2k_merge_ppm(&p_j2k->m_cp,p_manager);
    if (OVar5 != 0) {
      opj_event_msg(p_manager,4,"Main header has been correctly decoded.\n");
      OVar8 = opj_stream_tell(p_stream);
      p_j2k->cstr_index->main_head_end = (ulong)((int)OVar8 - 2);
      (p_j2k->m_specific_param).m_decoder.m_state = 8;
      return 1;
    }
    pcVar11 = "Failed to merge PPM data\n";
  }
  goto LAB_00110352;
}

Assistant:

static OPJ_BOOL opj_j2k_read_header_procedure( opj_j2k_t *p_j2k,
                                                                            opj_stream_private_t *p_stream,
                                                                            opj_event_mgr_t * p_manager)
{
        OPJ_UINT32 l_current_marker;
        OPJ_UINT32 l_marker_size;
        const opj_dec_memory_marker_handler_t * l_marker_handler = 00;
        OPJ_BOOL l_has_siz = 0;
        OPJ_BOOL l_has_cod = 0;
        OPJ_BOOL l_has_qcd = 0;

        /* preconditions */
        assert(p_stream != 00);
        assert(p_j2k != 00);
        assert(p_manager != 00);

        /*  We enter in the main header */
        p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_MHSOC;

        /* Try to read the SOC marker, the codestream must begin with SOC marker */
        if (! opj_j2k_read_soc(p_j2k,p_stream,p_manager)) {
                opj_event_msg(p_manager, EVT_ERROR, "Expected a SOC marker \n");
                return OPJ_FALSE;
        }

        /* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer */
        if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                return OPJ_FALSE;
        }

        /* Read 2 bytes as the new marker ID */
        opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);

        /* Try to read until the SOT is detected */
        while (l_current_marker != J2K_MS_SOT) {

                /* Check if the current marker ID is valid */
                if (l_current_marker < 0xff00) {
                        opj_event_msg(p_manager, EVT_ERROR, "A marker ID was expected (0xff--) instead of %.8x\n", l_current_marker);
                        return OPJ_FALSE;
                }

                /* Get the marker handler from the marker ID */
                l_marker_handler = opj_j2k_get_marker_handler(l_current_marker);

                /* Manage case where marker is unknown */
                if (l_marker_handler->id == J2K_MS_UNK) {
                        if (! opj_j2k_read_unk(p_j2k, p_stream, &l_current_marker, p_manager)){
                                opj_event_msg(p_manager, EVT_ERROR, "Unknow marker have been detected and generated error.\n");
                                return OPJ_FALSE;
                        }

                        if (l_current_marker == J2K_MS_SOT)
                                break; /* SOT marker is detected main header is completely read */
                        else    /* Get the marker handler from the marker ID */
                                l_marker_handler = opj_j2k_get_marker_handler(l_current_marker);
                }

                if (l_marker_handler->id == J2K_MS_SIZ) {
                    /* Mark required SIZ marker as found */
                    l_has_siz = 1;
                }
                if (l_marker_handler->id == J2K_MS_COD) {
                    /* Mark required COD marker as found */
                    l_has_cod = 1;
                }
                if (l_marker_handler->id == J2K_MS_QCD) {
                    /* Mark required QCD marker as found */
                    l_has_qcd = 1;
                }

                /* Check if the marker is known and if it is the right place to find it */
                if (! (p_j2k->m_specific_param.m_decoder.m_state & l_marker_handler->states) ) {
                        opj_event_msg(p_manager, EVT_ERROR, "Marker is not compliant with its position\n");
                        return OPJ_FALSE;
                }

                /* Try to read 2 bytes (the marker size) from stream and copy them into the buffer */
                if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                        opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                        return OPJ_FALSE;
                }

                /* read 2 bytes as the marker size */
                opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_marker_size,2);
                l_marker_size -= 2; /* Subtract the size of the marker ID already read */

                /* Check if the marker size is compatible with the header data size */
                if (l_marker_size > p_j2k->m_specific_param.m_decoder.m_header_data_size) {
                        OPJ_BYTE *new_header_data = (OPJ_BYTE *) opj_realloc(p_j2k->m_specific_param.m_decoder.m_header_data, l_marker_size);
                        if (! new_header_data) {
                                opj_free(p_j2k->m_specific_param.m_decoder.m_header_data);
                                p_j2k->m_specific_param.m_decoder.m_header_data = NULL;
                                p_j2k->m_specific_param.m_decoder.m_header_data_size = 0;
                                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read header\n");
                                return OPJ_FALSE;
                        }
                        p_j2k->m_specific_param.m_decoder.m_header_data = new_header_data;
                        p_j2k->m_specific_param.m_decoder.m_header_data_size = l_marker_size;
                }

                /* Try to read the rest of the marker segment from stream and copy them into the buffer */
                if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size,p_manager) != l_marker_size) {
                        opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                        return OPJ_FALSE;
                }

                /* Read the marker segment with the correct marker handler */
                if (! (*(l_marker_handler->handler))(p_j2k,p_j2k->m_specific_param.m_decoder.m_header_data,l_marker_size,p_manager)) {
                        opj_event_msg(p_manager, EVT_ERROR, "Marker handler function failed to read the marker segment\n");
                        return OPJ_FALSE;
                }

                /* Add the marker to the codestream index*/
                if (OPJ_FALSE == opj_j2k_add_mhmarker(
                                        p_j2k->cstr_index,
                                        l_marker_handler->id,
                                        (OPJ_UINT32) opj_stream_tell(p_stream) - l_marker_size - 4,
                                        l_marker_size + 4 )) {
                        opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to add mh marker\n");
                        return OPJ_FALSE;
                }

                /* Try to read 2 bytes (the next marker ID) from stream and copy them into the buffer */
                if (opj_stream_read_data(p_stream,p_j2k->m_specific_param.m_decoder.m_header_data,2,p_manager) != 2) {
                        opj_event_msg(p_manager, EVT_ERROR, "Stream too short\n");
                        return OPJ_FALSE;
                }

                /* read 2 bytes as the new marker ID */
                opj_read_bytes(p_j2k->m_specific_param.m_decoder.m_header_data,&l_current_marker,2);
        }

        if (l_has_siz == 0) {
            opj_event_msg(p_manager, EVT_ERROR, "required SIZ marker not found in main header\n");
            return OPJ_FALSE;
        }
        if (l_has_cod == 0) {
            opj_event_msg(p_manager, EVT_ERROR, "required COD marker not found in main header\n");
            return OPJ_FALSE;
        }
        if (l_has_qcd == 0) {
            opj_event_msg(p_manager, EVT_ERROR, "required QCD marker not found in main header\n");
            return OPJ_FALSE;
        }
	
        if (! opj_j2k_merge_ppm(&(p_j2k->m_cp), p_manager)) {
            opj_event_msg(p_manager, EVT_ERROR, "Failed to merge PPM data\n");
            return OPJ_FALSE;
        }

        opj_event_msg(p_manager, EVT_INFO, "Main header has been correctly decoded.\n");

        /* Position of the last element if the main header */
        p_j2k->cstr_index->main_head_end = (OPJ_UINT32) opj_stream_tell(p_stream) - 2;

        /* Next step: read a tile-part header */
        p_j2k->m_specific_param.m_decoder.m_state = J2K_STATE_TPHSOT;

        return OPJ_TRUE;
}